

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_1::renderReferenceTriangle(PixelBufferAccess *dst,Vec4 (*vertices) [3])

{
  Renderer renderer;
  Program program;
  RefFragmentShader fragShader;
  MultisamplePixelBufferAccess colorBuffer;
  RefVertexShader vertShader;
  RenderTarget renderTarget;
  Renderer local_341;
  Program local_340;
  int local_328;
  int iStack_324;
  undefined8 uStack_320;
  DrawCommand local_318;
  VertexAttrib local_2e8;
  FragmentShader local_2c0;
  MultisamplePixelBufferAccess local_288;
  VertexShader local_260;
  RenderState local_228;
  PrimitiveList local_138;
  RenderTarget local_118;
  
  rr::VertexShader::VertexShader(&local_260,1,0);
  local_260._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00cecce0;
  (local_260.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&local_2c0,0,1);
  local_2c0._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00cecd10;
  (local_2c0.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_340.geometryShader = (GeometryShader *)0x0;
  local_340.vertexShader = &local_260;
  local_340.fragmentShader = &local_2c0;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_288,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_228);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_318);
  rr::RenderTarget::RenderTarget
            (&local_118,&local_288,(MultisamplePixelBufferAccess *)&local_228,
             (MultisamplePixelBufferAccess *)&local_318);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_318,&local_288);
  local_328 = local_318.renderTarget._4_4_;
  iStack_324 = (int)local_318.program;
  uStack_320 = 0;
  local_228.cullMode = CULLMODE_NONE;
  local_228.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  local_228.rasterization.winding = WINDING_CCW;
  local_228.rasterization.horizontalFill = FILL_LEFT;
  local_228.rasterization.verticalFill = FILL_BOTTOM;
  local_228.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&local_228.fragOps);
  local_228.point.pointSize = 1.0;
  local_228.viewport.rect.left = 0;
  local_228.viewport.rect.bottom = 0;
  local_228.viewport.rect.width = local_328;
  local_228.viewport.rect.height = iStack_324;
  local_228.viewport.zn = 0.0;
  local_228.viewport.zf = 1.0;
  local_228.line.lineWidth = 1.0;
  local_228.restart.enabled = false;
  local_228.restart.restartIndex = 0xffffffff;
  local_228.viewportOrientation = VIEWPORTORIENTATION_UPPER_LEFT;
  local_228.rasterization.viewportOrientation = VIEWPORTORIENTATION_UPPER_LEFT;
  rr::Renderer::Renderer(&local_341);
  local_2e8.type = VERTEXATTRIBTYPE_FLOAT;
  local_2e8.size = 4;
  local_2e8.stride = 0x10;
  local_2e8.instanceDivisor = 0;
  local_2e8.generic.v._0_8_ = 0;
  local_2e8.generic.v._8_8_ = 0;
  local_2e8.pointer = vertices;
  rr::PrimitiveList::PrimitiveList(&local_138,PRIMITIVETYPE_TRIANGLES,3,0);
  local_318.program = &local_340;
  local_318.numVertexAttribs = 1;
  local_318.vertexAttribs = &local_2e8;
  local_318.state = &local_228;
  local_318.primitives = &local_138;
  local_318.renderTarget = &local_118;
  rr::Renderer::draw(&local_341,&local_318);
  rr::Renderer::~Renderer(&local_341);
  rr::FragmentShader::~FragmentShader(&local_2c0);
  rr::VertexShader::~VertexShader(&local_260);
  return;
}

Assistant:

void renderReferenceTriangle (const tcu::PixelBufferAccess& dst, const tcu::Vec4 (&vertices)[3])
{
	const RefVertexShader					vertShader;
	const RefFragmentShader					fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)), rr::VIEWPORTORIENTATION_UPPER_LEFT);
	const rr::Renderer						renderer;
	const rr::VertexAttrib					vertexAttribs[]	=
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, vertices[0].getPtr())
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, DE_LENGTH_OF_ARRAY(vertices), 0)));
}